

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

int xmlParseSGMLCatalog(xmlCatalogPtr catal,xmlChar *value,char *file,int super)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  xmlChar *base;
  ulong uVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlCatalogEntryPtr pxVar8;
  xmlChar *pxVar9;
  byte *pbVar10;
  xmlCatalogEntryType type;
  xmlChar *name;
  xmlChar *sysid;
  xmlCatalogPtr local_40;
  int local_34;
  
  if (file == (char *)0x0) {
    iVar3 = -1;
  }
  else {
    local_40 = catal;
    local_34 = super;
    base = xmlStrdup((xmlChar *)file);
LAB_0015e236:
    if (value != (byte *)0x0) {
      bVar2 = *value;
      iVar3 = 0;
      if (bVar2 == 0) goto LAB_0015e719;
      pbVar10 = value + 2;
      value = value + 4;
      while (bVar2 < 0x2e) {
        uVar5 = (ulong)bVar2;
        if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
          if (uVar5 == 0) goto LAB_0015e719;
          if ((uVar5 == 0x2d) && (pbVar10[-1] == 0x2d)) goto LAB_0015e431;
          break;
        }
        pbVar1 = pbVar10 + -1;
        pbVar10 = pbVar10 + 1;
        value = value + 1;
        bVar2 = *pbVar1;
      }
      sysid = (xmlChar *)0x0;
      name = (xmlChar *)0x0;
      value = xmlParseSGMLCatalogName(pbVar10 + -2,&name);
      pxVar7 = name;
      if ((value == (byte *)0x0) || (name == (xmlChar *)0x0)) {
LAB_0015e711:
        iVar3 = -(uint)(value == (byte *)0x0);
        goto LAB_0015e719;
      }
      uVar5 = (ulong)*value;
      if ((0x20 < uVar5) || ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0)) {
        (*xmlFree)(name);
        iVar3 = 0;
        goto LAB_0015e719;
      }
      while (((byte)uVar5 < 0x21 && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0))) {
        pbVar10 = value + 1;
        value = value + 1;
        uVar5 = (ulong)*pbVar10;
      }
      iVar3 = xmlStrEqual(name,"SYSTEM");
      if (iVar3 == 0) {
        iVar4 = xmlStrEqual(pxVar7,(xmlChar *)"PUBLIC");
        if (iVar4 != 0) {
          type = SGML_CATA_PUBLIC;
          goto LAB_0015e45a;
        }
        iVar4 = xmlStrEqual(pxVar7,(xmlChar *)"DELEGATE");
        if (iVar4 != 0) {
          type = SGML_CATA_DELEGATE;
          goto LAB_0015e45a;
        }
        iVar3 = xmlStrEqual(pxVar7,"ENTITY");
        if (iVar3 != 0) {
          (*xmlFree)(pxVar7);
          type = (uint)(*value == 0x25) + SGML_CATA_ENTITY;
LAB_0015e53b:
          name = (xmlChar *)0x0;
          value = xmlParseSGMLCatalogName(value,&name);
          if (value != (byte *)0x0) {
            uVar5 = (ulong)*value;
            if ((uVar5 < 0x21) && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0)) {
              while (((byte)uVar5 < 0x21 && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0))) {
                pbVar10 = value + 1;
                value = value + 1;
                uVar5 = (ulong)*pbVar10;
              }
              goto LAB_0015e5a1;
            }
            goto LAB_0015e5e5;
          }
          goto LAB_0015e736;
        }
        iVar3 = xmlStrEqual(pxVar7,(xmlChar *)"DOCTYPE");
        if (iVar3 != 0) {
          type = SGML_CATA_DOCTYPE;
LAB_0015e525:
          (*xmlFree)(pxVar7);
          goto LAB_0015e53b;
        }
        iVar3 = xmlStrEqual(pxVar7,(xmlChar *)"LINKTYPE");
        if (iVar3 != 0) {
          type = SGML_CATA_LINKTYPE;
          goto LAB_0015e525;
        }
        iVar3 = xmlStrEqual(pxVar7,(xmlChar *)"NOTATION");
        if (iVar3 != 0) {
          type = SGML_CATA_NOTATION;
          goto LAB_0015e525;
        }
        iVar3 = xmlStrEqual(pxVar7,(xmlChar *)"SGMLDECL");
        if (iVar3 != 0) {
          type = SGML_CATA_SGMLDECL;
LAB_0015e58b:
          (*xmlFree)(pxVar7);
          name = (xmlChar *)0x0;
          goto LAB_0015e5a1;
        }
        iVar3 = xmlStrEqual(pxVar7,(xmlChar *)"DOCUMENT");
        if (iVar3 != 0) {
          type = SGML_CATA_DOCUMENT;
          goto LAB_0015e58b;
        }
        iVar3 = xmlStrEqual(pxVar7,"CATALOG");
        if (iVar3 != 0) {
          type = SGML_CATA_CATALOG;
          goto LAB_0015e58b;
        }
        iVar3 = xmlStrEqual(pxVar7,(xmlChar *)"BASE");
        if (iVar3 != 0) {
          type = SGML_CATA_BASE;
          goto LAB_0015e58b;
        }
        iVar3 = xmlStrEqual(pxVar7,(xmlChar *)"OVERRIDE");
        (*xmlFree)(pxVar7);
        if (iVar3 == 0) goto LAB_0015e6d9;
        value = xmlParseSGMLCatalogName(value,&name);
        pxVar7 = name;
        if (name == (xmlChar *)0x0) goto LAB_0015e711;
      }
      else {
        type = SGML_CATA_SYSTEM;
LAB_0015e45a:
        (*xmlFree)(pxVar7);
        name = (xmlChar *)0x0;
        value = xmlParseSGMLCatalogPubid(value,&name);
        pxVar7 = name;
        if (value == (byte *)0x0) {
LAB_0015e736:
          if (name != (xmlChar *)0x0) {
            (*xmlFree)(name);
          }
          iVar3 = -1;
          if (sysid != (xmlChar *)0x0) {
            (*xmlFree)(sysid);
          }
          goto LAB_0015e719;
        }
        pxVar9 = name;
        if ((iVar3 == 0) &&
           (pxVar6 = xmlCatalogNormalizePublic(name), pxVar9 = name, pxVar6 != (xmlChar *)0x0)) {
          if (pxVar7 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar7);
          }
          pxVar9 = pxVar6;
          if (*pxVar6 == '\0') {
            (*xmlFree)(pxVar6);
            name = (xmlChar *)0x0;
            pxVar9 = name;
          }
        }
        name = pxVar9;
        uVar5 = (ulong)*value;
        if ((uVar5 < 0x21) && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0)) {
          while (((byte)uVar5 < 0x21 && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0))) {
            pbVar10 = value + 1;
            value = value + 1;
            uVar5 = (ulong)*pbVar10;
          }
LAB_0015e5a1:
          value = xmlParseSGMLCatalogPubid(value,&sysid);
          if (value == (byte *)0x0) goto LAB_0015e736;
          if (type != SGML_CATA_BASE) goto LAB_0015e5e5;
          if (base != (xmlChar *)0x0) {
            (*xmlFree)(base);
          }
          base = xmlStrdup(sysid);
        }
        else {
LAB_0015e5e5:
          pxVar7 = sysid;
          if ((uint)(type + ~XML_CATA_DELEGATE_URI) < 2) {
            pxVar7 = xmlBuildURI(sysid,base);
            pxVar9 = name;
            if (pxVar7 != (xmlChar *)0x0) {
              pxVar8 = xmlNewCatalogEntry(type,name,pxVar7,(xmlChar *)0x0,XML_CATA_PREFER_NONE,
                                          (xmlCatalogEntryPtr)0x0);
              iVar3 = xmlHashAddEntry(local_40->sgml,pxVar9,pxVar8);
              if (iVar3 < 0) {
                xmlFreeCatalogEntry(pxVar8,pxVar9);
              }
LAB_0015e6b4:
              (*xmlFree)(pxVar7);
            }
          }
          else if (type == SGML_CATA_CATALOG) {
            if (local_34 == 0) {
              pxVar7 = xmlBuildURI(sysid,base);
              if (pxVar7 != (xmlChar *)0x0) {
                xmlExpandCatalog(local_40,(char *)pxVar7);
                goto LAB_0015e6b4;
              }
            }
            else {
              pxVar8 = xmlNewCatalogEntry(SGML_CATA_CATALOG,sysid,(xmlChar *)0x0,(xmlChar *)0x0,
                                          XML_CATA_PREFER_NONE,(xmlCatalogEntryPtr)0x0);
              iVar3 = xmlHashAddEntry(local_40->sgml,pxVar7,pxVar8);
              if (iVar3 < 0) {
                xmlFreeCatalogEntry(pxVar8,pxVar7);
              }
            }
          }
        }
        if (name != (xmlChar *)0x0) {
          (*xmlFree)(name);
        }
LAB_0015e6d9:
        pxVar7 = sysid;
        if (sysid == (xmlChar *)0x0) goto LAB_0015e236;
      }
      (*xmlFree)(pxVar7);
      goto LAB_0015e236;
    }
LAB_0015e70c:
    iVar3 = -1;
LAB_0015e719:
    if (base != (xmlChar *)0x0) {
      (*xmlFree)(base);
    }
  }
  return iVar3;
LAB_0015e431:
  if (value[-2] == 0x2d) {
    if (value[-1] == 0x2d) goto LAB_0015e236;
  }
  else if (value[-2] == 0) goto LAB_0015e70c;
  value = value + 1;
  goto LAB_0015e431;
}

Assistant:

static int
xmlParseSGMLCatalog(xmlCatalogPtr catal, const xmlChar *value,
	            const char *file, int super) {
    const xmlChar *cur = value;
    xmlChar *base = NULL;
    int res;

    if ((cur == NULL) || (file == NULL))
        return(-1);
    base = xmlStrdup((const xmlChar *) file);

    while ((cur != NULL) && (cur[0] != 0)) {
	SKIP_BLANKS;
	if (cur[0] == 0)
	    break;
	if ((cur[0] == '-') && (cur[1] == '-')) {
	    cur = xmlParseSGMLCatalogComment(cur);
	    if (cur == NULL) {
		/* error */
		break;
	    }
	} else {
	    xmlChar *sysid = NULL;
	    xmlChar *name = NULL;
	    xmlCatalogEntryType type = XML_CATA_NONE;

	    cur = xmlParseSGMLCatalogName(cur, &name);
	    if (cur == NULL || name == NULL) {
		/* error */
		break;
	    }
	    if (!IS_BLANK_CH(*cur)) {
		/* error */
		xmlFree(name);
		break;
	    }
	    SKIP_BLANKS;
	    if (xmlStrEqual(name, (const xmlChar *) "SYSTEM"))
                type = SGML_CATA_SYSTEM;
	    else if (xmlStrEqual(name, (const xmlChar *) "PUBLIC"))
                type = SGML_CATA_PUBLIC;
	    else if (xmlStrEqual(name, (const xmlChar *) "DELEGATE"))
                type = SGML_CATA_DELEGATE;
	    else if (xmlStrEqual(name, (const xmlChar *) "ENTITY"))
                type = SGML_CATA_ENTITY;
	    else if (xmlStrEqual(name, (const xmlChar *) "DOCTYPE"))
                type = SGML_CATA_DOCTYPE;
	    else if (xmlStrEqual(name, (const xmlChar *) "LINKTYPE"))
                type = SGML_CATA_LINKTYPE;
	    else if (xmlStrEqual(name, (const xmlChar *) "NOTATION"))
                type = SGML_CATA_NOTATION;
	    else if (xmlStrEqual(name, (const xmlChar *) "SGMLDECL"))
                type = SGML_CATA_SGMLDECL;
	    else if (xmlStrEqual(name, (const xmlChar *) "DOCUMENT"))
                type = SGML_CATA_DOCUMENT;
	    else if (xmlStrEqual(name, (const xmlChar *) "CATALOG"))
                type = SGML_CATA_CATALOG;
	    else if (xmlStrEqual(name, (const xmlChar *) "BASE"))
                type = SGML_CATA_BASE;
	    else if (xmlStrEqual(name, (const xmlChar *) "OVERRIDE")) {
		xmlFree(name);
		cur = xmlParseSGMLCatalogName(cur, &name);
		if (name == NULL) {
		    /* error */
		    break;
		}
		xmlFree(name);
		continue;
	    }
	    xmlFree(name);
	    name = NULL;

	    switch(type) {
		case SGML_CATA_ENTITY:
		    if (*cur == '%')
			type = SGML_CATA_PENTITY;
                    /* Falls through. */
		case SGML_CATA_PENTITY:
		case SGML_CATA_DOCTYPE:
		case SGML_CATA_LINKTYPE:
		case SGML_CATA_NOTATION:
		    cur = xmlParseSGMLCatalogName(cur, &name);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    if (!IS_BLANK_CH(*cur)) {
			/* error */
			break;
		    }
		    SKIP_BLANKS;
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		case SGML_CATA_PUBLIC:
		case SGML_CATA_SYSTEM:
		case SGML_CATA_DELEGATE:
		    cur = xmlParseSGMLCatalogPubid(cur, &name);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    if (type != SGML_CATA_SYSTEM) {
		        xmlChar *normid;

		        normid = xmlCatalogNormalizePublic(name);
		        if (normid != NULL) {
		            if (name != NULL)
		                xmlFree(name);
		            if (*normid != 0)
		                name = normid;
		            else {
		                xmlFree(normid);
		                name = NULL;
		            }
		        }
		    }
		    if (!IS_BLANK_CH(*cur)) {
			/* error */
			break;
		    }
		    SKIP_BLANKS;
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		case SGML_CATA_BASE:
		case SGML_CATA_CATALOG:
		case SGML_CATA_DOCUMENT:
		case SGML_CATA_SGMLDECL:
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		default:
		    break;
	    }
	    if (cur == NULL) {
		if (name != NULL)
		    xmlFree(name);
		if (sysid != NULL)
		    xmlFree(sysid);
		break;
	    } else if (type == SGML_CATA_BASE) {
		if (base != NULL)
		    xmlFree(base);
		base = xmlStrdup(sysid);
	    } else if ((type == SGML_CATA_PUBLIC) ||
		       (type == SGML_CATA_SYSTEM)) {
		xmlChar *filename;

		filename = xmlBuildURI(sysid, base);
		if (filename != NULL) {
		    xmlCatalogEntryPtr entry;

		    entry = xmlNewCatalogEntry(type, name, filename,
			                       NULL, XML_CATA_PREFER_NONE, NULL);
		    res = xmlHashAddEntry(catal->sgml, name, entry);
		    if (res < 0) {
			xmlFreeCatalogEntry(entry, NULL);
		    }
		    xmlFree(filename);
		}

	    } else if (type == SGML_CATA_CATALOG) {
		if (super) {
		    xmlCatalogEntryPtr entry;

		    entry = xmlNewCatalogEntry(type, sysid, NULL, NULL,
			                       XML_CATA_PREFER_NONE, NULL);
		    res = xmlHashAddEntry(catal->sgml, sysid, entry);
		    if (res < 0) {
			xmlFreeCatalogEntry(entry, NULL);
		    }
		} else {
		    xmlChar *filename;

		    filename = xmlBuildURI(sysid, base);
		    if (filename != NULL) {
			xmlExpandCatalog(catal, (const char *)filename);
			xmlFree(filename);
		    }
		}
	    }
	    /*
	     * drop anything else we won't handle it
	     */
	    if (name != NULL)
		xmlFree(name);
	    if (sysid != NULL)
		xmlFree(sysid);
	}
    }
    if (base != NULL)
	xmlFree(base);
    if (cur == NULL)
	return(-1);
    return(0);
}